

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void print_2D_double(double *a,int ld,int *lo,int *hi)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  
  iVar1 = *lo;
  if (iVar1 <= *hi) {
    pdVar4 = a + iVar1;
    lVar3 = (long)iVar1;
    do {
      iVar1 = lo[1];
      if (iVar1 <= hi[1]) {
        lVar6 = (long)iVar1 + -1;
        pdVar5 = (double *)((long)ld * 8 * (long)iVar1 + (long)pdVar4);
        do {
          printf("%13f ",*pdVar5);
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + ld;
        } while (lVar6 < hi[1]);
      }
      putchar(10);
      pdVar4 = pdVar4 + 1;
      bVar2 = lVar3 < *hi;
      lVar3 = lVar3 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void print_2D_double(double *a, int ld, int *lo, int *hi)
{
int i,j;
     for(i=lo[0];i<=hi[0];i++){
       for(j=lo[1];j<=hi[1];j++) printf("%13f ",a[ld*j+i]);
       printf("\n");
     }
}